

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alignment_engine.cpp
# Opt level: O0

unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> __thiscall
spoa::AlignmentEngine::Create
          (AlignmentEngine *this,AlignmentType type,int8_t m,int8_t n,int8_t g,int8_t e,int8_t q,
          int8_t c)

{
  bool bVar1;
  invalid_argument *piVar2;
  AlignmentSubtype local_7c;
  unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> local_38;
  unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> dst;
  AlignmentSubtype subtype;
  int8_t local_20;
  int8_t e_local;
  int8_t g_local;
  int8_t n_local;
  int8_t m_local;
  AlignmentType type_local;
  
  if (((type != kSW) && (type != kNW)) && (type != kOV)) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,"[spoa::AlignmentEngine::Create] error: invalid alignment type!");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if (('\0' < g) || ('\0' < q)) {
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (piVar2,
               "[spoa::AlignmentEngine::Create] error: gap opening penalty must be non-positive!");
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  if ((e < '\x01') && (c < '\x01')) {
    if (g < e) {
      local_7c = kConvex;
      if (g <= q || c <= e) {
        local_7c = kAffine;
      }
    }
    else {
      local_7c = kLinear;
    }
    dst._M_t.
    super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>._M_t.
    super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>.
    super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl._0_4_ = local_7c;
    local_20 = g;
    if ((local_7c != kLinear) && (local_20 = e, local_7c == kAffine)) {
      q = g;
      c = e;
    }
    CreateSimdAlignmentEngine((spoa *)&local_38,type,local_7c,m,n,g,local_20,q,c);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_38);
    if (bVar1) {
      std::unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>::
      unique_ptr((unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_> *)
                 this,&local_38);
    }
    else {
      SisdAlignmentEngine::Create
                ((SisdAlignmentEngine *)this,type,
                 (AlignmentSubtype)
                 dst._M_t.
                 super___uniq_ptr_impl<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spoa::AlignmentEngine_*,_std::default_delete<spoa::AlignmentEngine>_>
                 .super__Head_base<0UL,_spoa::AlignmentEngine_*,_false>._M_head_impl,m,n,g,local_20,
                 q,c);
    }
    std::unique_ptr<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>_>::~unique_ptr
              (&local_38);
    return (__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
            )(__uniq_ptr_data<spoa::AlignmentEngine,_std::default_delete<spoa::AlignmentEngine>,_true,_true>
              )this;
  }
  piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (piVar2,
             "[spoa::AlignmentEngine::Create] error: gap extension penalty must be non-positive!");
  __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::unique_ptr<AlignmentEngine> AlignmentEngine::Create(
    AlignmentType type,
    std::int8_t m,
    std::int8_t n,
    std::int8_t g,
    std::int8_t e,
    std::int8_t q,
    std::int8_t c) {
  if (type != AlignmentType::kSW &&
      type != AlignmentType::kNW &&
      type != AlignmentType::kOV) {
    throw std::invalid_argument(
        "[spoa::AlignmentEngine::Create] error: invalid alignment type!");
  }
  if (g > 0 || q > 0) {
    throw std::invalid_argument(
        "[spoa::AlignmentEngine::Create] error: "
        "gap opening penalty must be non-positive!");
  }
  if (e > 0 || c > 0) {
    throw std::invalid_argument(
        "[spoa::AlignmentEngine::Create] error: "
        "gap extension penalty must be non-positive!");
  }

  AlignmentSubtype subtype = g >= e ?
      AlignmentSubtype::kLinear : (g <= q || e >= c ?
      AlignmentSubtype::kAffine : AlignmentSubtype::kConvex);

  if (subtype == AlignmentSubtype::kLinear) {
    e = g;
  } else if (subtype == AlignmentSubtype::kAffine) {
    q = g;
    c = e;
  }

  auto dst = CreateSimdAlignmentEngine(type, subtype, m, n, g, e, q, c);
  if (!dst) {
    return SisdAlignmentEngine::Create(type, subtype, m, n, g, e, q, c);
  }
  return dst;
}